

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O2

boolean read_scan_integer(FILE *file,long *result,int *termchar)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  boolean bVar5;
  
  bVar1 = read_text_integer(file,result,termchar);
  bVar5 = 0;
  if (bVar1 != 0) {
    iVar2 = *termchar;
    ppuVar4 = __ctype_b_loc();
    while ((iVar2 != -1 && ((*(byte *)((long)*ppuVar4 + (long)iVar2 * 2 + 1) & 0x20) != 0))) {
      iVar2 = text_getc(file);
    }
    if ((*(byte *)((long)*ppuVar4 + (long)iVar2 * 2 + 1) & 8) == 0) {
      iVar3 = 0x20;
      if (0xfffffffd < iVar2 - 0x3cU) {
        iVar3 = iVar2;
      }
      if (iVar2 == -1) {
        iVar3 = iVar2;
      }
    }
    else {
      iVar2 = ungetc(iVar2,(FILE *)file);
      if (iVar2 == -1) {
        return 0;
      }
      iVar3 = 0x20;
    }
    *termchar = iVar3;
    bVar5 = 1;
  }
  return bVar5;
}

Assistant:

LOCAL(boolean)
read_scan_integer(FILE *file, long *result, int *termchar)
/* Variant of read_text_integer that always looks for a non-space termchar;
 * this simplifies parsing of punctuation in scan scripts.
 */
{
  register int ch;

  if (!read_text_integer(file, result, termchar))
    return FALSE;
  ch = *termchar;
  while (ch != EOF && isspace(ch))
    ch = text_getc(file);
  if (isdigit(ch)) {            /* oops, put it back */
    if (ungetc(ch, file) == EOF)
      return FALSE;
    ch = ' ';
  } else {
    /* Any separators other than ';' and ':' are ignored;
     * this allows user to insert commas, etc, if desired.
     */
    if (ch != EOF && ch != ';' && ch != ':')
      ch = ' ';
  }
  *termchar = ch;
  return TRUE;
}